

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

bool __thiscall xmrig::CpuLaunchStatus::started(CpuLaunchStatus *this,IWorker *worker,bool ready)

{
  long lVar1;
  byte in_DL;
  long *in_RSI;
  long *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<unsigned_long,_unsigned_long> hugePages;
  VirtualMemory *local_28;
  
  if ((in_DL & 1) == 0) {
    *in_RDI = *in_RDI + 1;
  }
  else {
    (**(code **)(*in_RSI + 0x18))();
    pVar2 = VirtualMemory::hugePages(local_28);
    in_RDI[4] = in_RDI[4] + 1;
    local_28 = (VirtualMemory *)pVar2.first;
    in_RDI[1] = (long)local_28 + in_RDI[1];
    in_RDI[3] = pVar2.second + in_RDI[3];
    lVar1 = (**(code **)(*in_RSI + 0x28))();
    in_RDI[6] = lVar1 + in_RDI[6];
  }
  return in_RDI[4] + *in_RDI == in_RDI[5];
}

Assistant:

inline bool started(IWorker *worker, bool ready)
    {
        if (ready) {
            auto hugePages = worker->memory()->hugePages();

            m_started++;
            m_hugePages += hugePages.first;
            m_pages     += hugePages.second;
            m_ways      += worker->intensity();
        }
        else {
            m_errors++;
        }

        return (m_started + m_errors) == m_threads;
    }